

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  
  switch((ms->cParams).minMatch) {
  default:
    ms_local = (ZSTD_matchState_t *)
               ZSTD_compressBlock_doubleFast_dictMatchState_4(ms,seqStore,rep,src,srcSize);
    break;
  case 5:
    ms_local = (ZSTD_matchState_t *)
               ZSTD_compressBlock_doubleFast_dictMatchState_5(ms,seqStore,rep,src,srcSize);
    break;
  case 6:
    ms_local = (ZSTD_matchState_t *)
               ZSTD_compressBlock_doubleFast_dictMatchState_6(ms,seqStore,rep,src,srcSize);
    break;
  case 7:
    ms_local = (ZSTD_matchState_t *)
               ZSTD_compressBlock_doubleFast_dictMatchState_7(ms,seqStore,rep,src,srcSize);
  }
  return (size_t)ms_local;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}